

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hex_float.h
# Opt level: O1

uint_type __thiscall
spvtools::utils::
HexFloat<spvtools::utils::FloatProxy<float>,_spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<float>_>_>
::getNormalizedSignificand
          (HexFloat<spvtools::utils::FloatProxy<float>,_spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<float>_>_>
           *this)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  
  uVar1 = (this->value_).data_;
  if ((uVar1 & 0x7fffffff) == 0) {
    iVar3 = 0;
  }
  else {
    uVar2 = uVar1 >> 0x17 & 0xff;
    if (uVar2 == 0) {
      iVar3 = -0x7f;
      if ((uVar1 >> 0x16 & 1) == 0) {
        uVar2 = 0x1f;
        if ((uVar1 & 0x3fffff) != 0) {
          for (; (uVar1 & 0x3fffff) >> uVar2 == 0; uVar2 = uVar2 - 1) {
          }
        }
        iVar3 = (uVar2 ^ 0xffffffe0) - 0x75;
      }
    }
    else {
      iVar3 = uVar2 - 0x7f;
    }
  }
  if (iVar3 < -0x7e) {
    iVar3 = iVar3 + 0x7e;
    do {
      uVar1 = uVar1 * 2;
      iVar3 = iVar3 + 1;
    } while (iVar3 != 0);
  }
  return uVar1 & 0x7fffff;
}

Assistant:

uint_type data() const { return data_; }